

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

format_arg * __thiscall
fmt::v5::internal::
context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
::do_get_arg(format_arg *__return_storage_ptr__,
            context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
            *this,uint arg_id)

{
  long lVar1;
  longlong lVar2;
  size_t sVar3;
  type tVar4;
  
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  ::do_get(__return_storage_ptr__,&this->args_,arg_id);
  tVar4 = __return_storage_ptr__->type_;
  if (tVar4 == named_arg_type) {
    lVar1 = (__return_storage_ptr__->value_).field_0.long_long_value;
    lVar2 = *(longlong *)(lVar1 + 0x10);
    sVar3 = *(size_t *)(lVar1 + 0x18);
    tVar4 = *(type *)(lVar1 + 0x20);
    __return_storage_ptr__->type_ = tVar4;
    (__return_storage_ptr__->value_).field_0.long_long_value = lVar2;
    (__return_storage_ptr__->value_).field_0.string.size = sVar3;
  }
  if (tVar4 == none_type) {
    error_handler::on_error((error_handler *)this,"argument index out of range");
  }
  return __return_storage_ptr__;
}

Assistant:

format_arg do_get_arg(unsigned arg_id) {
    format_arg arg = args_.get(arg_id);
    if (!arg)
      parse_context_.on_error("argument index out of range");
    return arg;
  }